

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.hpp
# Opt level: O2

void __thiscall
pico_tree::
kd_tree<std::vector<pico_tree::point<float,2ul>,std::allocator<pico_tree::point<float,2ul>>>,pico_tree::metric_l2_squared,int>
::
search_nearest<pico_tree::internal::point_wrapper<pico_tree::point<float,2ul>>,search_nn_counter<pico_tree::neighbor<int,float>>>
          (kd_tree<std::vector<pico_tree::point<float,2ul>,std::allocator<pico_tree::point<float,2ul>>>,pico_tree::metric_l2_squared,int>
           *this,point_type *point,search_nn_counter<pico_tree::neighbor<int,_float>_> *visitor)

{
  search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point<float,_2UL>_>,_search_nn_counter<pico_tree::neighbor<int,_float>_>,_int>
  local_30;
  
  local_30.indices_ = (vector<int,_std::allocator<int>_> *)(this + 0x20);
  local_30.node_box_offset_.elems_._M_elems = (Elems__)(_Type)0x0;
  local_30.space_.space_ = (space_type *)this;
  local_30.query_.point_ = point;
  local_30.visitor_ = visitor;
  internal::
  search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point<float,_2UL>_>,_search_nn_counter<pico_tree::neighbor<int,_float>_>,_int>
  ::operator()(&local_30,*(node_type **)(this + 0x68));
  return;
}

Assistant:

inline void search_nearest(
      PointWrapper_ point, Visitor_& visitor, euclidean_space_tag) const {
    internal::search_nearest_euclidean<
        space_wrapper_type,
        Metric_,
        PointWrapper_,
        Visitor_,
        index_type>(
        space_wrapper_type(space_), metric_, data_.indices, point, visitor)(
        data_.root_node);
  }